

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

StringRef llvm::sys::path::root_name(StringRef path,Style style)

{
  StringRef SVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  Style SVar5;
  StringRef *pSVar6;
  size_t sVar7;
  reference pSVar8;
  path *this;
  Style in_R8D;
  StringRef path_00;
  StringRef path_01;
  bool local_d1;
  bool local_c9;
  StringRef local_c8;
  bool local_b2;
  bool local_b1;
  bool has_drive;
  path *ppStack_b0;
  bool has_net;
  char *local_a8;
  undefined1 local_a0 [8];
  const_iterator e;
  undefined1 local_60 [8];
  const_iterator b;
  Style style_local;
  StringRef path_local;
  size_t local_10;
  ulong uVar9;
  
  path_local.Data = (char *)path.Length;
  this = (path *)path.Data;
  path_00.Length._0_4_ = style;
  path_00.Data = path_local.Data;
  path_00.Length._4_4_ = 0;
  uVar9 = (ulong)style;
  e._40_8_ = this;
  b._44_4_ = style;
  begin((const_iterator *)local_60,this,path_00,in_R8D);
  local_a8 = path_local.Data;
  path_01.Length = uVar9;
  path_01.Data = path_local.Data;
  ppStack_b0 = this;
  end((const_iterator *)local_a0,this,path_01);
  bVar2 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
          ::operator!=((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                        *)local_60,(const_iterator *)local_a0);
  if (bVar2) {
    pSVar6 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
             ::operator->((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                           *)local_60);
    sVar7 = StringRef::size(pSVar6);
    local_c9 = false;
    if (2 < sVar7) {
      pSVar8 = const_iterator::operator*((const_iterator *)local_60);
      cVar3 = StringRef::operator[](pSVar8,0);
      bVar2 = is_separator(cVar3,b._44_4_);
      local_c9 = false;
      if (bVar2) {
        pSVar8 = const_iterator::operator*((const_iterator *)local_60);
        cVar3 = StringRef::operator[](pSVar8,1);
        pSVar8 = const_iterator::operator*((const_iterator *)local_60);
        cVar4 = StringRef::operator[](pSVar8,0);
        local_c9 = cVar3 == cVar4;
      }
    }
    local_b1 = local_c9;
    SVar5 = anon_unknown.dwarf_3697931::real_style(b._44_4_);
    local_d1 = false;
    if (SVar5 == windows) {
      pSVar6 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
               ::operator->((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                             *)local_60);
      StringRef::StringRef(&local_c8,":");
      local_d1 = StringRef::endswith(pSVar6,local_c8);
    }
    local_b2 = local_d1;
    if (((local_b1 & 1U) != 0) || (local_d1 != false)) {
      pSVar8 = const_iterator::operator*((const_iterator *)local_60);
      path_local.Length = (size_t)pSVar8->Data;
      local_10 = pSVar8->Length;
      goto LAB_02889d1d;
    }
  }
  memset(&path_local.Length,0,0x10);
  StringRef::StringRef((StringRef *)&path_local.Length);
LAB_02889d1d:
  SVar1.Length = local_10;
  SVar1.Data = (char *)path_local.Length;
  return SVar1;
}

Assistant:

StringRef root_name(StringRef path, Style style) {
  const_iterator b = begin(path, style), e = end(path);
  if (b != e) {
    bool has_net =
        b->size() > 2 && is_separator((*b)[0], style) && (*b)[1] == (*b)[0];
    bool has_drive = (real_style(style) == Style::windows) && b->endswith(":");

    if (has_net || has_drive) {
      // just {C:,//net}, return the first component.
      return *b;
    }
  }

  // No path or no name.
  return StringRef();
}